

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O1

void __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::push_token(jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
             *this,token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *tok,static_resources *resources,
            vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
            *output_stack,error_code *ec)

{
  unary_operator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer ptVar5;
  token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *ptVar6;
  size_t sVar7;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *peVar8;
  assertion_error *this_00;
  json_runtime_error<std::runtime_error,_void> *this_01;
  long lVar9;
  token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *ptVar10;
  jmespath_errc __e;
  static_resources *psVar11;
  pointer __b;
  token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *ptVar12;
  iterator __first;
  pointer ptVar13;
  __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  __tmp;
  long lVar14;
  vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
  *this_02;
  vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
  *this_03;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *this_04;
  size_t sVar15;
  vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
  key_toks;
  type key;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  toks;
  vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
  local_e8;
  token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_c8;
  static_resources *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [32];
  pointer ptStack_80;
  pointer local_78;
  error_code *local_70;
  undefined1 local_68 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_5_62c6233c_for_token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_4
  local_40;
  
  local_c0 = resources;
  psVar11 = (static_resources *)output_stack;
  switch(tok->type_) {
  case current_node:
  case pipe:
  case key:
  case begin_expression_type:
  case variable:
  case variable_binding:
    goto switchD_0038fe8d_caseD_0;
  case lparen:
    psVar11 = (static_resources *)&this->operator_stack_;
    goto LAB_0038fe92;
  case rparen:
    unwind_rparen(this,output_stack,ec);
    return;
  case begin_multi_select_hash:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)output_stack,tok);
    local_b8._8_8_ = local_a8 + 8;
    local_b8._0_4_ = lparen;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0._0_8_ = auStack_a0._0_8_ & 0xffffffffffffff00;
    auStack_a0._16_8_ =
         (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)0x0;
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)&this->operator_stack_,
               (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_b8);
    break;
  case end_multi_select_hash:
    local_c8 = tok;
    unwind_rparen(this,output_stack,ec);
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ptVar5 = (output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ptVar13 = (output_stack->
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_70 = ec;
    if ((ptVar13 != ptVar5) && (ptVar13[-1].type_ != begin_multi_select_hash)) {
      do {
        local_68._0_8_ = (_func_int **)0x0;
        local_68._8_8_ = (pointer)0x0;
        local_68._16_8_ = 0;
        paVar2 = &ptVar13[-2].key_.field_2;
        lVar14 = 0;
        ptVar5 = ptVar13;
        do {
          lVar9 = lVar14;
          paVar4 = paVar2;
          ptVar5 = ptVar5 + -1;
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
          ::
          emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                      *)local_68,ptVar5);
          if (ptVar5 == (output_stack->
                        super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) break;
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)paVar4 + -0x38);
          lVar14 = lVar9 + 0x38;
        } while (*(int *)((long)paVar4 + -0x18) != 0xb);
        if (*(int *)((long)paVar4 + -0x18) != 0xb) {
          this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
          local_b8._0_8_ = local_b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"assertion \'(*it).is_key()\' failed at  <> :0","");
          assertion_error::assertion_error(this_00,(string *)local_b8);
          __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_b8._0_8_ = (((string_type *)(paVar4 + -1))->_M_dataplus)._M_p;
        if (paVar4 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._0_8_) {
          local_a8 = (undefined1  [8])paVar4->_M_allocated_capacity;
          auStack_a0._0_8_ = *(undefined8 *)((long)paVar4 + 8);
          local_b8._0_8_ = local_b8 + 0x10;
        }
        else {
          local_a8 = (undefined1  [8])paVar4->_M_allocated_capacity;
        }
        local_b8._8_8_ = *(size_type *)((long)paVar4 + -8);
        (((string_type *)(paVar4 + -1))->_M_dataplus)._M_p = (pointer)paVar4;
        *(size_type *)((long)paVar4 + -8) = 0;
        paVar4->_M_local_buf[0] = '\0';
        lVar14 = -0xa8 - lVar9;
        if (*(int *)(paVar4 + -5) != 10) {
          lVar14 = -0x70 - lVar9;
        }
        ptVar13 = (pointer)((long)&ptVar13->type_ + lVar14);
        if (*(int *)(local_68._8_8_ + -0x38) != 0xc) {
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
          ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                      *)local_68,(current_node_arg_t *)&current_node_arg);
        }
        std::
        __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
                  (local_68._0_8_,local_68._8_8_);
        std::
        vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::key_tokens,std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::key_tokens>>
        ::
        emplace_back<std::__cxx11::string,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                  ((vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::key_tokens,std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::key_tokens>>
                    *)&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                   (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                    *)local_68);
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,(long)local_a8 + 1);
        }
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
        ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                   *)local_68);
        ptVar5 = (output_stack->
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while ((ptVar13 != ptVar5) && (ptVar13[-1].type_ != begin_multi_select_hash));
    }
    if (ptVar13 == ptVar5) {
      std::error_code::operator=(local_70,unbalanced_braces);
      goto LAB_00390dd9;
    }
    __b = (pointer)(local_e8.
                    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1);
    ptVar5 = (pointer)local_e8.
                      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    if (local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_start < __b &&
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::
        swap<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::key_tokens>
                  ((key_tokens *)ptVar5,(key_tokens *)__b);
        ptVar5 = ptVar5 + 1;
        __b = __b + -1;
      } while (ptVar5 < __b);
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
    ::_M_erase(output_stack,ptVar13 + -1,
               (output_stack->
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    ptVar5 = (output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (((output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start == ptVar5) ||
       (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::is_projection(ptVar5 + -1), !bVar3)) {
LAB_00390d46:
      this_03 = (vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                 *)&local_50;
      local_68._8_8_ = (pointer)0x1;
      local_68._16_8_ = local_68._16_8_ & 0xffffffffffff0000;
      local_68._0_8_ = &PTR__multi_select_hash_00b60738;
      local_50._M_allocated_capacity =
           (size_type)
           local_e8.
           super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_50._8_8_ =
           local_e8.
           super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_40.expression_ =
           (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)local_e8.
              super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_a0._16_8_ =
           jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
           ::static_resources::
           create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::multi_select_hash>
                     ((static_resources *)local_c0,(multi_select_hash *)local_68);
      local_b8._8_8_ = local_a8 + 8;
      local_b8._0_4_ = 0xd;
      local_a8 = (undefined1  [8])0x0;
      auStack_a0._0_8_ = auStack_a0._0_8_ & 0xffffffffffffff00;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)output_stack,
                 (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)local_b8);
      token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
      ~token((token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)local_b8);
    }
    else {
      sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               ::precedence_level(local_c8);
      sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              ::precedence_level((output_stack->
                                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1);
      if (sVar7 <= sVar15) {
        sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 ::precedence_level(local_c8);
        sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::precedence_level((output_stack->
                                   super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1);
        if ((sVar15 != sVar7) ||
           (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    ::is_right_associative(local_c8), !bVar3)) goto LAB_00390d46;
      }
      puVar1 = (output_stack->
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1].field_2.unary_operator_;
      this_03 = (vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                 *)(local_a8 + 8);
      local_b8._8_8_ = (pointer)0x1;
      local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffffffff0000);
      local_b8._0_8_ = &PTR__multi_select_hash_00b60738;
      auStack_a0._0_8_ =
           local_e8.
           super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
           ._M_impl.super__Vector_impl_data._M_start;
      auStack_a0._8_8_ =
           local_e8.
           super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      auStack_a0._16_8_ =
           local_e8.
           super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      peVar8 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
               ::static_resources::
               create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::multi_select_hash>
                         ((static_resources *)local_c0,(multi_select_hash *)local_b8);
      (*puVar1->_vptr_unary_operator[3])(puVar1,peVar8);
    }
    std::
    vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ::~vector(this_03);
LAB_00390dd9:
    std::
    vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ::~vector(&local_e8);
    return;
  case begin_multi_select_list:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)output_stack,tok);
    local_b8._8_8_ = local_a8 + 8;
    local_b8._0_4_ = lparen;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0._0_8_ = auStack_a0._0_8_ & 0xffffffffffffff00;
    auStack_a0._16_8_ =
         (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)0x0;
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)&this->operator_stack_,
               (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_b8);
    break;
  case end_multi_select_list:
    local_c8 = tok;
    unwind_rparen(this,output_stack,ec);
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ptVar6 = (output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ptVar12 = (output_stack->
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((ptVar12 != ptVar6) && (ptVar12[-1].type_ != begin_multi_select_list)) {
      do {
        local_b8._0_8_ = (undefined **)0x0;
        local_b8._8_8_ = (pointer)0x0;
        local_a8 = (undefined1  [8])0x0;
        ptVar6 = ptVar12 + -2;
        do {
          ptVar10 = ptVar6;
          ptVar12 = ptVar10 + 1;
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
          ::
          emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                      *)local_b8,ptVar12);
          if ((ptVar12 ==
               (output_stack->
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start) || (ptVar10->type_ == separator)) break;
          ptVar6 = ptVar10 + -1;
        } while (ptVar10->type_ != begin_multi_select_list);
        if (ptVar10->type_ == separator) {
          ptVar12 = ptVar10;
        }
        if (*(int *)(local_b8._8_8_ + -0x38) != 0xc) {
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
          ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                      *)local_b8,(current_node_arg_t *)&current_node_arg);
        }
        std::
        __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
                  (local_b8._0_8_,local_b8._8_8_);
        std::
        vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
        ::
        emplace_back<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>
                  ((vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
                    *)&local_e8,
                   (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                    *)local_b8);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
        ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                   *)local_b8);
        ptVar6 = (output_stack->
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while ((ptVar12 != ptVar6) && (ptVar12[-1].type_ != begin_multi_select_list));
    }
    if (ptVar12 == ptVar6) {
      std::error_code::operator=(ec,unbalanced_braces);
      goto LAB_00390d08;
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
    ::_M_erase(output_stack,ptVar12 + -1,
               (output_stack->
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    std::
    __reverse<__gnu_cxx::__normal_iterator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>*,std::vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>,std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>>>
              (local_e8.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_e8.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    ptVar5 = (output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (((output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start == ptVar5) ||
       (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::is_projection(ptVar5 + -1), !bVar3)) {
LAB_00390c75:
      this_02 = (vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
                 *)&local_50;
      local_68._8_8_ = (pointer)0x1;
      local_68._16_8_ = local_68._16_8_ & 0xffffffffffff0000;
      local_68._0_8_ = &PTR__multi_select_list_00b606d8;
      local_50._M_allocated_capacity =
           (size_type)
           local_e8.
           super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_50._8_8_ =
           local_e8.
           super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_40.expression_ =
           (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)local_e8.
              super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_a0._16_8_ =
           jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
           ::static_resources::
           create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::multi_select_list>
                     ((static_resources *)local_c0,(multi_select_list *)local_68);
      local_b8._8_8_ = local_a8 + 8;
      local_b8._0_4_ = 0xd;
      local_a8 = (undefined1  [8])0x0;
      auStack_a0._0_8_ = auStack_a0._0_8_ & 0xffffffffffffff00;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)output_stack,
                 (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)local_b8);
      token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
      ~token((token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)local_b8);
    }
    else {
      sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               ::precedence_level(local_c8);
      sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              ::precedence_level((output_stack->
                                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1);
      if (sVar7 <= sVar15) {
        sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 ::precedence_level(local_c8);
        sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::precedence_level((output_stack->
                                   super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1);
        if ((sVar15 != sVar7) ||
           (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    ::is_right_associative(local_c8), !bVar3)) goto LAB_00390c75;
      }
      puVar1 = (output_stack->
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1].field_2.unary_operator_;
      this_02 = (vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
                 *)(local_a8 + 8);
      local_b8._8_8_ = (pointer)0x1;
      local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffffffff0000);
      local_b8._0_8_ = &PTR__multi_select_list_00b606d8;
      auStack_a0._0_8_ =
           local_e8.
           super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
           ._M_impl.super__Vector_impl_data._M_start;
      auStack_a0._8_8_ =
           local_e8.
           super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      auStack_a0._16_8_ =
           local_e8.
           super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.
      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      peVar8 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
               ::static_resources::
               create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::multi_select_list>
                         ((static_resources *)local_c0,(multi_select_list *)local_b8);
      (*puVar1->_vptr_unary_operator[3])(puVar1,peVar8);
    }
    std::
    vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
    ::~vector(this_02);
LAB_00390d08:
    std::
    vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
    ::~vector((vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>_>
               *)&local_e8);
    return;
  case begin_filter:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)output_stack,tok);
    local_b8._8_8_ = local_a8 + 8;
    local_b8._0_4_ = lparen;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0._0_8_ = auStack_a0._0_8_ & 0xffffffffffffff00;
    auStack_a0._16_8_ =
         (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)0x0;
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)&this->operator_stack_,
               (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_b8);
    break;
  case end_filter:
    unwind_rparen(this,output_stack,ec);
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ptVar5 = (output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar14 = -(long)ptVar5;
    while( true ) {
      ptVar12 = ptVar5 + -1;
      lVar14 = lVar14 + 0x38;
      ptVar13 = (output_stack->
                super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ptVar5 == ptVar13) || (ptVar12->type_ == begin_filter)) break;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)&local_e8,ptVar12);
      ptVar5 = ptVar12;
    }
    if (ptVar5 != ptVar13) {
      if (*(int *)&(((string_type *)
                    &((pointer)
                     (local_e8.
                      super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1))->type_)->_M_dataplus)._M_p
          != 0xc) {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
        ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                    *)&local_e8,(current_node_arg_t *)&current_node_arg);
      }
      std::
      __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
                (local_e8.
                 super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_e8.
                 super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      ::_M_erase(output_stack,
                 (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)-lVar14,
                 (output_stack->
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
      ptVar5 = (output_stack->
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (((output_stack->
           super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start == ptVar5) ||
         (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::is_projection(ptVar5 + -1), !bVar3)) {
LAB_00390ba8:
        local_b8._8_8_ = &DAT_0000000b;
        local_a8._0_2_ = 0x101;
        auStack_a0._0_8_ = (key_tokens *)0x0;
        auStack_a0._8_8_ = (key_tokens *)0x0;
        auStack_a0._16_8_ = (pointer)0x0;
        local_b8._0_8_ = &PTR__filter_expression_00b605b0;
        auStack_a0._24_8_ =
             local_e8.
             super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ptStack_80 = (pointer)local_e8.
                              super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
        local_78 = (pointer)local_e8.
                            super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_40.expression_ =
             jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
             ::static_resources::
             create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::filter_expression>
                       ((static_resources *)local_c0,(filter_expression *)local_b8);
        local_68._8_8_ = &local_50;
        local_68._0_4_ = 0xd;
        local_68._16_8_ = 0;
        local_50._M_allocated_capacity = local_50._M_allocated_capacity & 0xffffffffffffff00;
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
        ::
        emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                    *)output_stack,
                   (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)local_68);
        token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        ::~token((token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)local_68);
      }
      else {
        sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 ::precedence_level(tok);
        sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::precedence_level((output_stack->
                                   super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1);
        if (sVar7 <= sVar15) {
          sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   ::precedence_level(tok);
          sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::precedence_level((output_stack->
                                     super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + -1);
          if ((sVar15 != sVar7) ||
             (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      ::is_right_associative(tok), !bVar3)) goto LAB_00390ba8;
        }
        puVar1 = (output_stack->
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1].field_2.unary_operator_;
        local_b8._8_8_ = &DAT_0000000b;
        local_a8._0_2_ = 0x101;
        auStack_a0._0_8_ = (key_tokens *)0x0;
        auStack_a0._8_8_ = (key_tokens *)0x0;
        auStack_a0._16_8_ = (pointer)0x0;
        local_b8._0_8_ = &PTR__filter_expression_00b605b0;
        auStack_a0._24_8_ =
             local_e8.
             super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
             ._M_impl.super__Vector_impl_data._M_start;
        ptStack_80 = (pointer)local_e8.
                              super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
        local_78 = (pointer)local_e8.
                            super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        peVar8 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                 ::static_resources::
                 create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::filter_expression>
                           ((static_resources *)local_c0,(filter_expression *)local_b8);
        (*puVar1->_vptr_unary_operator[3])(puVar1,peVar8);
      }
      filter_expression::~filter_expression((filter_expression *)local_b8);
      goto LAB_00390eb9;
    }
    __e = unbalanced_braces;
    goto LAB_003909a2;
  case separator:
    unwind_rparen(this,output_stack,ec);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)output_stack,tok);
    local_b8._8_8_ = local_a8 + 8;
    local_b8._0_4_ = lparen;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0._0_8_ = auStack_a0._0_8_ & 0xffffffffffffff00;
    auStack_a0._16_8_ =
         (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)0x0;
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)&this->operator_stack_,
               (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_b8);
    break;
  case literal:
    ptVar5 = (output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (((output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start != ptVar5) && (ptVar5[-1].type_ == current_node)
       ) {
      token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
      operator=(ptVar5 + -1,tok);
      return;
    }
    goto switchD_0038fe8d_caseD_0;
  case expression:
    ptVar5 = (output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (((output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start != ptVar5) &&
       (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::is_projection(ptVar5 + -1), bVar3)) {
      sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               ::precedence_level(tok);
      sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              ::precedence_level((output_stack->
                                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1);
      if (sVar15 < sVar7) {
LAB_00390663:
        puVar1 = (output_stack->
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1].field_2.unary_operator_;
        (*puVar1->_vptr_unary_operator[3])(puVar1,(tok->field_2).expression_);
        return;
      }
      sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               ::precedence_level(tok);
      sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              ::precedence_level((output_stack->
                                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1);
      if ((sVar15 == sVar7) &&
         (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::is_right_associative(tok), bVar3)) goto LAB_00390663;
    }
switchD_0038fe8d_caseD_0:
LAB_0038fe92:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)psVar11,tok);
    return;
  case binary_operator:
  case unary_operator:
    psVar11 = (static_resources *)&this->operator_stack_;
    ptVar5 = (this->operator_stack_).
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((this->operator_stack_).
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start != ptVar5) && (ptVar5[-1].type_ != lparen)) {
      sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
               ::precedence_level(tok);
      sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              ::precedence_level((this->operator_stack_).
                                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + -1);
      if (sVar7 <= sVar15) {
        sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 ::precedence_level(tok);
        sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::precedence_level((this->operator_stack_).
                                   super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1);
        if ((sVar15 != sVar7) ||
           (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    ::is_right_associative(tok), !bVar3)) {
          ptVar12 = (this->operator_stack_).
                    super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          __first._M_current = ptVar12;
          local_c8 = tok;
          if (ptVar12 !=
              (this->operator_stack_).
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            while (local_c0 = psVar11, ptVar6 = __first._M_current + -1, psVar11 = local_c0,
                  (ptVar6->type_ & ~lparen) == binary_operator) {
              sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       ::precedence_level(tok);
              sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      ::precedence_level(ptVar6);
              if (sVar15 <= sVar7) {
                sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                         ::precedence_level(tok);
                sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                        ::precedence_level(ptVar6);
                __first._M_current = ptVar12;
                psVar11 = local_c0;
                if ((sVar15 != sVar7) ||
                   (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                            ::is_right_associative(tok), psVar11 = local_c0, !bVar3)) break;
              }
              ptVar12 = ptVar12 + -1;
              std::
              vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
              ::
              emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                        ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                          *)output_stack,ptVar6);
              __first._M_current = ptVar6;
              psVar11 = local_c0;
              if (ptVar6 == (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                             *)(local_c0->custom_functions_)._M_h._M_buckets) break;
            }
          }
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          ::_M_erase((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                      *)psVar11,__first,
                     (this->operator_stack_).
                     super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          tok = local_c8;
        }
      }
    }
    goto LAB_0038fe92;
  case function:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)output_stack,tok);
    local_b8._8_8_ = local_a8 + 8;
    local_b8._0_4_ = lparen;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0._0_8_ = auStack_a0._0_8_ & 0xffffffffffffff00;
    auStack_a0._16_8_ =
         (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)0x0;
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)&this->operator_stack_,
               (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_b8);
    break;
  case end_function:
    local_c8 = tok;
    local_70 = ec;
    unwind_rparen(this,output_stack,ec);
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ptVar5 = (output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar14 = -(long)ptVar5;
    sVar15 = 0;
    while( true ) {
      ptVar12 = ptVar5 + -1;
      lVar14 = lVar14 + 0x38;
      ptVar13 = (output_stack->
                super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ptVar5 == ptVar13) || (ptVar12->type_ == function)) break;
      sVar15 = sVar15 + (ptVar12->type_ == argument);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)&local_e8,ptVar12);
      ptVar5 = ptVar12;
    }
    ec = local_70;
    if (ptVar5 == ptVar13) {
      __e = unbalanced_parentheses;
    }
    else {
      if (((ptVar12->type_ != function) ||
          (((ptVar5[-1].field_2.expression_)->is_right_associative_ & 1U) == 0)) ||
         (sVar15 == (ptVar5[-1].field_2.expression_)->precedence_level_)) {
        if (sVar15 == 0) {
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
          ::
          emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                      *)&local_e8,ptVar12);
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          ::_M_erase(output_stack,
                     (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      *)-lVar14,
                     (output_stack->
                     super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
          local_68._8_8_ = (pointer)0x1;
          local_68._16_8_ = local_68._16_8_ & 0xffffffffffff0000;
          local_68._0_8_ = &PTR__function_expression_00b60780;
          local_50._M_allocated_capacity =
               (size_type)
               local_e8.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_50._8_8_ =
               local_e8.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_40.expression_ =
               (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_e8.
                  super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_e8.
          super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.
          super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.
          super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          auStack_a0._16_8_ =
               jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
               ::static_resources::
               create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::function_expression>
                         ((static_resources *)local_c0,(function_expression *)local_68);
          local_b8._8_8_ = local_a8 + 8;
          local_b8._0_4_ = 0xd;
          local_a8 = (undefined1  [8])0x0;
          auStack_a0._0_8_ = auStack_a0._0_8_ & 0xffffffffffffff00;
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
          ::
          emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                      *)output_stack,
                     (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      *)local_b8);
          goto LAB_00390ea7;
        }
        if (*(int *)&(((string_type *)
                      &((pointer)
                       (local_e8.
                        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1))->type_)->_M_dataplus)._M_p
            != 0xc) {
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
          ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                      *)&local_e8,(current_node_arg_t *)&current_node_arg);
        }
        std::
        __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
                  (local_e8.
                   super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_e8.
                   super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
        ::
        emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                    *)&local_e8,ptVar12);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
        ::_M_erase(output_stack,
                   (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)-lVar14,
                   (output_stack->
                   super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        ptVar5 = (output_stack->
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (((output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start == ptVar5) ||
           (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    ::is_projection(ptVar5 + -1), !bVar3)) {
LAB_00390e26:
          local_68._8_8_ = (pointer)0x1;
          local_68._16_8_ = local_68._16_8_ & 0xffffffffffff0000;
          local_68._0_8_ = &PTR__function_expression_00b60780;
          local_50._M_allocated_capacity =
               (size_type)
               local_e8.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_50._8_8_ =
               local_e8.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_40.expression_ =
               (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_e8.
                  super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_e8.
          super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.
          super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.
          super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          auStack_a0._16_8_ =
               jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
               ::static_resources::
               create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::function_expression>
                         ((static_resources *)local_c0,(function_expression *)local_68);
          local_b8._8_8_ = local_a8 + 8;
          local_b8._0_4_ = 0xd;
          local_a8 = (undefined1  [8])0x0;
          auStack_a0._0_8_ = auStack_a0._0_8_ & 0xffffffffffffff00;
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
          ::
          emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                      *)output_stack,
                     (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      *)local_b8);
          goto LAB_00390ea7;
        }
        sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 ::precedence_level(local_c8);
        sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ::precedence_level((output_stack->
                                   super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish + -1);
        if (sVar7 <= sVar15) {
          sVar15 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   ::precedence_level(local_c8);
          sVar7 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  ::precedence_level((output_stack->
                                     super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + -1);
          if ((sVar15 != sVar7) ||
             (bVar3 = token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      ::is_right_associative(local_c8), !bVar3)) goto LAB_00390e26;
        }
        puVar1 = (output_stack->
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1].field_2.unary_operator_;
        this_04 = (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                   *)(local_a8 + 8);
        local_b8._8_8_ = (pointer)0x1;
        local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffffffff0000);
        local_b8._0_8_ = &PTR__function_expression_00b60780;
        auStack_a0._0_8_ =
             local_e8.
             super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
             ._M_impl.super__Vector_impl_data._M_start;
        auStack_a0._8_8_ =
             local_e8.
             super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        auStack_a0._16_8_ =
             local_e8.
             super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.
        super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        peVar8 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                 ::static_resources::
                 create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::function_expression>
                           ((static_resources *)local_c0,(function_expression *)local_b8);
        (*puVar1->_vptr_unary_operator[3])(puVar1,peVar8);
        goto LAB_00390eb1;
      }
      __e = invalid_arity;
    }
LAB_003909a2:
    std::error_code::operator=(ec,__e);
LAB_00390eb9:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
    ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               *)&local_e8);
    return;
  case argument:
    unwind_rparen(this,output_stack,ec);
    goto LAB_0038fe92;
  case end_expression_type:
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ptVar5 = (output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar14 = -(long)ptVar5;
    while( true ) {
      ptVar12 = ptVar5 + -1;
      ptVar13 = (output_stack->
                super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((ptVar5 == ptVar13) || (ptVar12->type_ == begin_expression_type)) break;
      lVar14 = lVar14 + 0x38;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)&local_e8,ptVar12);
      ptVar5 = ptVar12;
    }
    if (ptVar5 == ptVar13) {
      this_01 = (json_runtime_error<std::runtime_error,_void> *)__cxa_allocate_exception(0x18);
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Unbalanced braces","");
      json_runtime_error<std::runtime_error,_void>::json_runtime_error(this_01,(string *)local_b8);
      __cxa_throw(this_01,&json_runtime_error<std::runtime_error,void>::typeinfo,
                  json_runtime_error<std::runtime_error,_void>::~json_runtime_error);
    }
    if (*(int *)&(((string_type *)
                  &((pointer)
                   (local_e8.
                    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1))->type_)->_M_dataplus)._M_p !=
        0xc) {
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)&local_e8,(current_node_arg_t *)&current_node_arg);
    }
    std::
    __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>>>
              (local_e8.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_e8.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
    ::_M_erase(output_stack,
               (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)-lVar14,
               (output_stack->
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    local_68._8_8_ = (pointer)0x1;
    local_68._16_8_ = local_68._16_8_ & 0xffffffffffff0000;
    local_68._0_8_ = &PTR__function_expression_00b60780;
    local_50._M_allocated_capacity =
         (size_type)
         local_e8.
         super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_50._8_8_ =
         local_e8.
         super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_40.expression_ =
         (expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)local_e8.
            super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_a0._16_8_ =
         jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
         ::static_resources::
         create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::function_expression>
                   ((static_resources *)local_c0,(function_expression *)local_68);
    local_b8._8_8_ = local_a8 + 8;
    local_b8._0_4_ = 0xd;
    local_a8 = (undefined1  [8])0x0;
    auStack_a0._0_8_ = auStack_a0._0_8_ & 0xffffffffffffff00;
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                *)output_stack,
               (token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *)local_b8);
LAB_00390ea7:
    this_04 = (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
               *)&local_50;
    token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
    ~token((token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)local_b8);
LAB_00390eb1:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
    ::~vector(this_04);
    goto LAB_00390eb9;
  case end_of_expression:
    ptVar6 = (this->operator_stack_).
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ptVar12 = (this->operator_stack_).
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (ptVar6 != ptVar12) {
      ptVar6 = ptVar6 + -1;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>>>
                  *)output_stack,ptVar6);
      ptVar12 = (this->operator_stack_).
                super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    ptVar6 = (this->operator_stack_).
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ptVar10 = ptVar12;
    if (ptVar6 == ptVar12) {
      return;
    }
    do {
      token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
      ~token(ptVar10);
      ptVar10 = ptVar10 + 1;
    } while (ptVar10 != ptVar6);
    (this->operator_stack_).
    super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ptVar12;
    return;
  default:
    goto switchD_0038fe8d_default;
  }
  token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>::
  ~token((token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)local_b8);
switchD_0038fe8d_default:
  return;
}

Assistant:

void push_token(token<Json>&& tok, static_resources& resources, 
            std::vector<token<Json>>& output_stack, std::error_code& ec)
        {
            switch (tok.type())
            {
                case token_kind::end_filter:
                {
                    unwind_rparen(output_stack, ec);
                    std::vector<token<Json>> toks;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_filter)
                    {
                        toks.emplace_back(std::move(*it));
                        ++it;
                    }
                    if (it == output_stack.rend())
                    {
                        ec = jmespath_errc::unbalanced_braces;
                        return;
                    }
                    if (toks.back().type() != token_kind::literal)
                    {
                        toks.emplace_back(current_node_arg);
                    }
                    std::reverse(toks.begin(), toks.end());
                    ++it;
                    output_stack.erase(it.base(),output_stack.end());

                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(resources.create_expression(filter_expression(std::move(toks))));
                    }
                    else
                    {
                        output_stack.push_back(resources.create_expression(filter_expression(std::move(toks))));
                    }
                    break;
                }
                case token_kind::end_multi_select_list:
                {
                    unwind_rparen(output_stack, ec);
                    std::vector<std::vector<token<Json>>> vals;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_multi_select_list)
                    {
                        std::vector<token<Json>> toks;
                        do
                        {
                            toks.emplace_back(std::move(*it));
                            ++it;
                        } while (it != output_stack.rend() && (*it).type() != token_kind::begin_multi_select_list && (*it).type() != token_kind::separator);
                        if ((*it).type() == token_kind::separator)
                        {
                            ++it;
                        }
                        if (toks.back().type() != token_kind::literal)
                        {
                            toks.emplace_back(current_node_arg);
                        }
                        std::reverse(toks.begin(), toks.end());
                        vals.emplace_back(std::move(toks));
                    }
                    if (it == output_stack.rend())
                    {
                        ec = jmespath_errc::unbalanced_braces;
                        return;
                    }
                    ++it;
                    output_stack.erase(it.base(),output_stack.end());
                    std::reverse(vals.begin(), vals.end());
                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(resources.create_expression(multi_select_list(std::move(vals))));
                    }
                    else
                    {
                        output_stack.push_back(resources.create_expression(multi_select_list(std::move(vals))));
                    }
                    break;
                }
                case token_kind::end_multi_select_hash:
                {
                    unwind_rparen(output_stack, ec);
                    std::vector<key_tokens> key_toks;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_multi_select_hash)
                    {
                        std::vector<token<Json>> toks;
                        do
                        {
                            toks.emplace_back(std::move(*it));
                            ++it;
                        } while (it != output_stack.rend() && (*it).type() != token_kind::key);
                        JSONCONS_ASSERT((*it).is_key());
                        auto key = std::move((*it).key_);
                        ++it;
                        if ((*it).type() == token_kind::separator)
                        {
                            ++it;
                        }
                        if (toks.back().type() != token_kind::literal)
                        {
                            toks.emplace_back(current_node_arg);
                        }
                        std::reverse(toks.begin(), toks.end());
                        key_toks.emplace_back(std::move(key), std::move(toks));
                    }
                    if (it == output_stack.rend())
                    {
                        ec = jmespath_errc::unbalanced_braces;
                        return;
                    }
                    std::reverse(key_toks.begin(), key_toks.end());
                    ++it;
                    output_stack.erase(it.base(),output_stack.end());

                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(resources.create_expression(multi_select_hash(std::move(key_toks))));
                    }
                    else
                    {
                        output_stack.push_back(resources.create_expression(multi_select_hash(std::move(key_toks))));
                    }
                    break;
                }
                case token_kind::end_expression_type:
                {
                    std::vector<token<Json>> toks;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_expression_type)
                    {
                        toks.emplace_back(std::move(*it));
                        ++it;
                    }
                    if (it == output_stack.rend())
                    {
                        JSONCONS_THROW(json_runtime_error<std::runtime_error>("Unbalanced braces"));
                    }
                    if (toks.back().type() != token_kind::literal)
                    {
                        toks.emplace_back(current_node_arg);
                    }
                    std::reverse(toks.begin(), toks.end());
                    output_stack.erase(it.base(),output_stack.end());
                    output_stack.push_back(resources.create_expression(function_expression(std::move(toks))));
                    break;
                }
                case token_kind::variable:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::variable_binding:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::literal:
                    if (!output_stack.empty() && output_stack.back().type() == token_kind::current_node)
                    {
                        output_stack.back() = std::move(tok);
                    }
                    else
                    {
                        output_stack.push_back(std::move(tok));
                    }
                    break;
                case token_kind::expression:
                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(tok.expression_);
                    }
                    else
                    {
                        output_stack.push_back(std::move(tok));
                    }
                    break;
                case token_kind::rparen:
                    {
                        unwind_rparen(output_stack, ec);
                        break;
                    }
                case token_kind::end_function:
                    {
                        unwind_rparen(output_stack, ec);
                        std::vector<token<Json>> toks;
                        auto it = output_stack.rbegin();
                        std::size_t arg_count = 0;
                        while (it != output_stack.rend() && (*it).type() != token_kind::function)
                        {
                            if ((*it).type() == token_kind::argument)
                            {
                                ++arg_count;
                            }
                            toks.emplace_back(std::move(*it));
                            ++it;
                        }
                        if (it == output_stack.rend())
                        {
                            ec = jmespath_errc::unbalanced_parentheses;
                            return;
                        }
                        if ((*it).arity() && arg_count != *((*it).arity()))
                        {
                            ec = jmespath_errc::invalid_arity;
                            return;
                        }
                        if (arg_count == 0)
                        {
                            toks.emplace_back(std::move(*it));
                            ++it;
                            output_stack.erase(it.base(), output_stack.end());
                            output_stack.push_back(resources.create_expression(function_expression(std::move(toks))));
                            break;
                        }
                        if (toks.back().type() != token_kind::literal)
                        {
                            toks.emplace_back(current_node_arg);
                        }
                        std::reverse(toks.begin(), toks.end());
                        toks.push_back(std::move(*it));
                        ++it;
                        output_stack.erase(it.base(),output_stack.end());

                        if (!output_stack.empty() && output_stack.back().is_projection() && 
                            (tok.precedence_level() < output_stack.back().precedence_level() ||
                            (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                        {
                            output_stack.back().expression_->add_expression(resources.create_expression(function_expression(std::move(toks))));
                        }
                        else
                        {
                            output_stack.push_back(resources.create_expression(function_expression(std::move(toks))));
                        }
                        break;
                    }
                case token_kind::end_of_expression:
                    {
                        auto it = operator_stack_.rbegin();
                        while (it != operator_stack_.rend())
                        {
                            output_stack.push_back(std::move(*it));
                            ++it;
                        }
                        operator_stack_.clear();
                        break;
                    }
                case token_kind::unary_operator:
                case token_kind::binary_operator:
                {
                    if (operator_stack_.empty() || operator_stack_.back().is_lparen())
                    {
                        operator_stack_.emplace_back(std::move(tok));
                    }
                    else if (tok.precedence_level() < operator_stack_.back().precedence_level()
                             || (tok.precedence_level() == operator_stack_.back().precedence_level() && tok.is_right_associative()))
                    {
                        operator_stack_.emplace_back(std::move(tok));
                    }
                    else
                    {
                        auto it = operator_stack_.rbegin();
                        while (it != operator_stack_.rend() && (*it).is_operator()
                               && (tok.precedence_level() > (*it).precedence_level()
                             || (tok.precedence_level() == (*it).precedence_level() && tok.is_right_associative())))
                        {
                            output_stack.push_back(std::move(*it));
                            ++it;
                        }

                        operator_stack_.erase(it.base(),operator_stack_.end());
                        operator_stack_.emplace_back(std::move(tok));
                    }
                    break;
                }
                case token_kind::separator:
                {
                    unwind_rparen(output_stack, ec);
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                }
                case token_kind::begin_filter:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::begin_multi_select_list:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::begin_multi_select_hash:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::function:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::current_node:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::key:
                case token_kind::pipe:
                case token_kind::begin_expression_type:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::argument:
                    unwind_rparen(output_stack, ec);
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::lparen:
                    operator_stack_.emplace_back(std::move(tok));
                    break;
                default:
                    break;
            }
        }